

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXMLResult(cmCTestLaunch *this,cmXMLWriter *xml)

{
  cmXMLWriter *pcVar1;
  int iVar2;
  char *local_e0;
  char *local_d8;
  cmsysProcess *local_d0;
  cmsysProcess *cp;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestLaunch *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  cmXMLWriter::Comment(xml,"Result of command");
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Result",&local_39);
  cmXMLWriter::StartElement(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"StdOut",&local_71);
  cmXMLWriter::StartElement(pcVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  DumpFileToXML(this,local_18,&this->LogOut);
  cmXMLWriter::EndElement(local_18);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"StdErr",&local_99);
  cmXMLWriter::StartElement(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  DumpFileToXML(this,local_18,&this->LogErr);
  cmXMLWriter::EndElement(local_18);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"ExitCondition",(allocator *)((long)&cp + 7));
  cmXMLWriter::StartElement(pcVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cp + 7));
  local_d0 = this->Process;
  iVar2 = cmsysProcess_GetState(local_d0);
  switch(iVar2) {
  case 0:
    cmXMLWriter::Content<char[29]>(local_18,(char (*) [29])"No process has been executed");
    break;
  case 1:
    cmXMLWriter::Content<char[37]>(local_18,(char (*) [37])"Error administrating child process: ");
    pcVar1 = local_18;
    local_e0 = cmsysProcess_GetErrorString(local_d0);
    cmXMLWriter::Content<char_const*>(pcVar1,&local_e0);
    break;
  case 2:
    cmXMLWriter::Content<char[24]>(local_18,(char (*) [24])"Terminated abnormally: ");
    pcVar1 = local_18;
    local_d8 = cmsysProcess_GetExceptionString(local_d0);
    cmXMLWriter::Content<char_const*>(pcVar1,&local_d8);
    break;
  case 3:
    cmXMLWriter::Content<char[31]>(local_18,(char (*) [31])"The process is still executing");
    break;
  case 4:
    cmXMLWriter::Content<int>(local_18,&this->ExitCode);
    break;
  case 5:
    cmXMLWriter::Content<char[28]>(local_18,(char (*) [28])"Killed when timeout expired");
    break;
  case 6:
    cmXMLWriter::Content<char[17]>(local_18,(char (*) [17])"Killed by parent");
    break;
  case 7:
    cmXMLWriter::Content<char[9]>(local_18,(char (*) [9])"Disowned");
  }
  cmXMLWriter::EndElement(local_18);
  cmXMLWriter::EndElement(local_18);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLResult(cmXMLWriter& xml)
{
  xml.Comment("Result of command");
  xml.StartElement("Result");

  // StdOut
  xml.StartElement("StdOut");
  this->DumpFileToXML(xml, this->LogOut);
  xml.EndElement(); // StdOut

  // StdErr
  xml.StartElement("StdErr");
  this->DumpFileToXML(xml, this->LogErr);
  xml.EndElement(); // StdErr

  // ExitCondition
  xml.StartElement("ExitCondition");
  cmsysProcess* cp = this->Process;
  switch (cmsysProcess_GetState(cp))
    {
    case cmsysProcess_State_Starting:
      xml.Content("No process has been executed"); break;
    case cmsysProcess_State_Executing:
      xml.Content("The process is still executing"); break;
    case cmsysProcess_State_Disowned:
      xml.Content("Disowned"); break;
    case cmsysProcess_State_Killed:
      xml.Content("Killed by parent"); break;

    case cmsysProcess_State_Expired:
      xml.Content("Killed when timeout expired"); break;
    case cmsysProcess_State_Exited:
      xml.Content(this->ExitCode); break;
    case cmsysProcess_State_Exception:
      xml.Content("Terminated abnormally: ");
      xml.Content(cmsysProcess_GetExceptionString(cp)); break;
    case cmsysProcess_State_Error:
      xml.Content("Error administrating child process: ");
      xml.Content(cmsysProcess_GetErrorString(cp)); break;
    };
  xml.EndElement(); // ExitCondition

  xml.EndElement(); // Result
}